

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http1.c
# Opt level: O2

FIOBJ headers2str(http_s *h,uintptr_t padding)

{
  uintptr_t uVar1;
  size_t sVar2;
  FIOBJ dest;
  ulong uVar3;
  long lVar4;
  FIOBJ FVar5;
  undefined1 *in_RCX;
  _func_int_FIOBJ_void_ptr *extraout_RDX;
  _func_int_FIOBJ_void_ptr *extraout_RDX_00;
  _func_int_FIOBJ_void_ptr *extraout_RDX_01;
  _func_int_FIOBJ_void_ptr *extraout_RDX_02;
  _func_int_FIOBJ_void_ptr *task;
  char *pcVar6;
  bool bVar7;
  size_t sStack_60;
  fio_str_info_s local_50;
  header_writer_s w;
  
  if ((h->method == 0) && (h->status_str != 0)) {
    return 0;
  }
  if (headers2str::connection_hash == 0) {
    headers2str::connection_hash = fiobj_hash_string("connection",10);
  }
  sVar2 = fiobj_hash_count((h->private_data).out_headers);
  dest = fiobj_str_buf(padding + sVar2 * 0x40);
  uVar1 = (h->private_data).flag;
  w.dest = dest;
  if (*(char *)(uVar1 + 0x101) != '\0') {
    if (h->method == 0) {
      pcVar6 = "GET ";
      sStack_60 = 4;
    }
    else {
      fiobj_str_concat(dest,h->method);
      pcVar6 = " ";
      sStack_60 = 1;
    }
    fiobj_str_write(dest,pcVar6,sStack_60);
    fiobj_str_concat(dest,h->path);
    if (h->query != 0) {
      fiobj_str_write(dest,"?",1);
      fiobj_str_concat(dest,h->query);
    }
    fiobj_str_write(dest," HTTP/1.1\r\n",0xb);
    if (headers2str::host_hash == 0) {
      headers2str::host_hash = fiobj_hash_string("host",4);
    }
    FVar5 = fiobj_hash_get2((h->private_data).out_headers,headers2str::host_hash);
    if ((FVar5 == 0) && (FVar5 = fiobj_hash_get2(h->headers,headers2str::host_hash), FVar5 != 0)) {
      fiobj_str_write(dest,"host:",5);
      fiobj_str_concat(dest,FVar5);
      fiobj_str_write(dest,"\r\n",2);
    }
    FVar5 = fiobj_hash_get2((h->private_data).out_headers,headers2str::connection_hash);
    task = extraout_RDX_00;
    if (FVar5 != 0) goto LAB_00144774;
    goto LAB_001446ad;
  }
  if ((h->status < 100) || (uVar3 = h->status - 100, 0x19b < uVar3)) {
LAB_00144572:
    sVar2 = 0x24;
    pcVar6 = "HTTP/1.1 500 Internal Server Error\r\n";
  }
  else {
    lVar4 = uVar3 * 0x18;
    in_RCX = http1pr_status2str_status2str;
    pcVar6 = *(char **)(http1pr_status2str_status2str + lVar4 + 0x10);
    if (pcVar6 == (char *)0x0) goto LAB_00144572;
    sVar2 = *(size_t *)(http1pr_status2str_status2str + lVar4 + 8);
  }
  fiobj_str_write(dest,pcVar6,sVar2);
  FVar5 = fiobj_hash_get2((h->private_data).out_headers,headers2str::connection_hash);
  if (FVar5 == 0) {
    FVar5 = fiobj_hash_get2(h->headers,headers2str::connection_hash);
    if (FVar5 == 0) {
      fiobj_obj2cstr(&local_50,h->version);
      bVar7 = *(char *)(uVar1 + 0x100) == '\0';
      in_RCX = (undefined1 *)CONCAT71((int7)((ulong)in_RCX >> 8),bVar7);
      if ((((((byte *)local_50.data == (byte *)0x0 || local_50.len < 8) || !bVar7) ||
           (local_50.data[5] != 0x31)) || (local_50.data[6] != 0x2e)) || (local_50.data[7] != 0x31))
      goto LAB_00144759;
    }
    else {
      fiobj_obj2cstr(&local_50,FVar5);
      if ((((byte *)local_50.data != (byte *)0x0) && (local_50.len != 0)) &&
         ((byte)(*local_50.data | 0x20U) != 0x6b)) {
LAB_00144759:
        fiobj_str_write(dest,"connection:close\r\n",0x12);
        task = extraout_RDX_02;
        goto LAB_0014476b;
      }
    }
LAB_001446ad:
    fiobj_str_write(dest,"connection:keep-alive\r\n",0x17);
    task = extraout_RDX_01;
  }
  else {
    fiobj_obj2cstr(&local_50,FVar5);
    task = extraout_RDX;
    if ((byte)(*local_50.data | 0x20U) != 99) goto LAB_00144774;
LAB_0014476b:
    *(undefined1 *)(uVar1 + 0x100) = 1;
  }
LAB_00144774:
  fiobj_each1((h->private_data).out_headers,(size_t)&w,task,in_RCX);
  fiobj_str_write(w.dest,"\r\n",2);
  return w.dest;
}

Assistant:

static FIOBJ headers2str(http_s *h, uintptr_t padding) {
  if (!h->method && !!h->status_str)
    return FIOBJ_INVALID;

  static uintptr_t connection_hash;
  if (!connection_hash)
    connection_hash = fiobj_hash_string("connection", 10);

  struct header_writer_s w;
  {
    const uintptr_t header_length_guess =
        fiobj_hash_count(h->private_data.out_headers) * 64;
    w.dest = fiobj_str_buf(header_length_guess + padding);
  }
  http1pr_s *p = handle2pr(h);

  if (p->is_client == 0) {
    fio_str_info_s t = http1pr_status2str(h->status);
    fiobj_str_write(w.dest, t.data, t.len);
    FIOBJ tmp = fiobj_hash_get2(h->private_data.out_headers, connection_hash);
    if (tmp) {
      t = fiobj_obj2cstr(tmp);
      if (t.data[0] == 'c' || t.data[0] == 'C')
        p->close = 1;
    } else {
      tmp = fiobj_hash_get2(h->headers, connection_hash);
      if (tmp) {
        t = fiobj_obj2cstr(tmp);
        if (!t.data || !t.len || t.data[0] == 'k' || t.data[0] == 'K')
          fiobj_str_write(w.dest, "connection:keep-alive\r\n", 23);
        else {
          fiobj_str_write(w.dest, "connection:close\r\n", 18);
          p->close = 1;
        }
      } else {
        t = fiobj_obj2cstr(h->version);
        if (!p->close && t.len > 7 && t.data && t.data[5] == '1' &&
            t.data[6] == '.' && t.data[7] == '1')
          fiobj_str_write(w.dest, "connection:keep-alive\r\n", 23);
        else {
          fiobj_str_write(w.dest, "connection:close\r\n", 18);
          p->close = 1;
        }
      }
    }
  } else {
    if (h->method) {
      fiobj_str_join(w.dest, h->method);
      fiobj_str_write(w.dest, " ", 1);
    } else {
      fiobj_str_write(w.dest, "GET ", 4);
    }
    fiobj_str_join(w.dest, h->path);
    if (h->query) {
      fiobj_str_write(w.dest, "?", 1);
      fiobj_str_join(w.dest, h->query);
    }
    fiobj_str_write(w.dest, " HTTP/1.1\r\n", 11);
    /* make sure we have a host header? */
    static uint64_t host_hash;
    if (!host_hash)
      host_hash = fiobj_hash_string("host", 4);
    FIOBJ tmp;
    if (!fiobj_hash_get2(h->private_data.out_headers, host_hash) &&
        (tmp = fiobj_hash_get2(h->headers, host_hash))) {
      fiobj_str_write(w.dest, "host:", 5);
      fiobj_str_join(w.dest, tmp);
      fiobj_str_write(w.dest, "\r\n", 2);
    }
    if (!fiobj_hash_get2(h->private_data.out_headers, connection_hash))
      fiobj_str_write(w.dest, "connection:keep-alive\r\n", 23);
  }

  fiobj_each1(h->private_data.out_headers, 0, write_header, &w);
  fiobj_str_write(w.dest, "\r\n", 2);
  return w.dest;
}